

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cpp
# Opt level: O1

HANDLE CreateEventA(LPSECURITY_ATTRIBUTES lpEventAttributes,BOOL bManualReset,BOOL bInitialState,
                   LPCSTR lpName)

{
  PAL_ERROR PVar1;
  CPalThread *pthr;
  PAL_ERROR *pPVar2;
  HANDLE local_38;
  HANDLE hEvent;
  
  local_38 = (HANDLE)0x0;
  if (PAL_InitializeChakraCoreCalled) {
    pthr = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
    if (pthr == (CPalThread *)0x0) {
      pthr = CreateCurrentThreadData();
    }
    if (lpName == (LPCSTR)0x0) {
      PVar1 = CorUnix::InternalCreateEvent
                        (pthr,lpEventAttributes,bManualReset,bInitialState,(LPCWSTR)0x0,&local_38);
    }
    else {
      fprintf(_stderr,"] %s %s:%d","CreateEventA",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchobj/event.cpp"
              ,0x69);
      fprintf(_stderr,"lpName: Cross-process named objects are not supported in PAL");
      PVar1 = 0x32;
    }
    pPVar2 = (PAL_ERROR *)__errno_location();
    *pPVar2 = PVar1;
    if (PAL_InitializeChakraCoreCalled != false) {
      return local_38;
    }
  }
  abort();
}

Assistant:

HANDLE
PALAPI
CreateEventA(
         IN LPSECURITY_ATTRIBUTES lpEventAttributes,
         IN BOOL bManualReset,
         IN BOOL bInitialState,
         IN LPCSTR lpName)
{
    HANDLE hEvent = NULL;
    CPalThread *pthr = NULL;
    PAL_ERROR palError;

    PERF_ENTRY(CreateEventA);
    ENTRY("CreateEventA(lpEventAttr=%p, bManualReset=%d, bInitialState=%d, lpName=%p (%s)\n",
          lpEventAttributes, bManualReset, bInitialState, lpName, lpName?lpName:"NULL");

    pthr = InternalGetCurrentThread();
    
    if (lpName != nullptr)
    {
        ASSERT("lpName: Cross-process named objects are not supported in PAL");
        palError = ERROR_NOT_SUPPORTED;
    }
    else
    {
        palError = InternalCreateEvent(
            pthr,
            lpEventAttributes,
            bManualReset,
            bInitialState,
            NULL,
            &hEvent
            );
    }

    //
    // We always need to set last error, even on success:
    // we need to protect ourselves from the situation
    // where last error is set to ERROR_ALREADY_EXISTS on
    // entry to the function
    //

    pthr->SetLastError(palError);
    
    LOGEXIT("CreateEventA returns HANDLE %p\n", hEvent);
    PERF_EXIT(CreateEventA);
    return hEvent;
}